

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_CodeOneMemBlock
               (CLzmaEncHandle pp,Bool reInit,Byte *dest,size_t *destLen,UInt32 desiredPackSize,
               UInt32 *unpackSize)

{
  undefined8 uVar1;
  code *local_78;
  CSeqOutStreamBuf outStream;
  SRes res;
  UInt64 nowPos64;
  CLzmaEnc *p;
  UInt32 *unpackSize_local;
  UInt32 desiredPackSize_local;
  size_t *destLen_local;
  Byte *dest_local;
  Bool reInit_local;
  CLzmaEncHandle pp_local;
  
  local_78 = MyWrite;
  outStream.data = (Byte *)*destLen;
  outStream.rem._0_4_ = 0;
  *(undefined4 *)((long)pp + 0x3d330) = 0;
  *(undefined4 *)((long)pp + 0x3d344) = 0;
  *(undefined4 *)((long)pp + 0x3d34c) = 0;
  outStream.funcTable.Write = (_func_size_t_void_ptr_void_ptr_size_t *)dest;
  if (reInit != 0) {
    LzmaEnc_Init((CLzmaEnc *)pp);
  }
  LzmaEnc_InitPrices((CLzmaEnc *)pp);
  uVar1 = *(undefined8 *)((long)pp + 0x3d338);
  RangeEnc_Init((CRangeEnc *)((long)pp + 0x3d2e8));
  *(code ***)((long)pp + 0x3d318) = &local_78;
  pp_local._4_4_ = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,1,desiredPackSize,*unpackSize);
  *unpackSize = (int)*(undefined8 *)((long)pp + 0x3d338) - (int)uVar1;
  *destLen = *destLen - (long)outStream.data;
  if ((int)outStream.rem != 0) {
    pp_local._4_4_ = 7;
  }
  return pp_local._4_4_;
}

Assistant:

SRes LzmaEnc_CodeOneMemBlock(CLzmaEncHandle pp, Bool reInit,
                             Byte* dest, size_t* destLen, UInt32 desiredPackSize, UInt32* unpackSize) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  UInt64 nowPos64;
  SRes res;
  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = False;
  p->finished = False;
  p->result = SZ_OK;

  if (reInit)
    LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  nowPos64 = p->nowPos64;
  RangeEnc_Init(&p->rc);
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_CodeOneBlock(p, True, desiredPackSize, *unpackSize);

  *unpackSize = (UInt32)(p->nowPos64 - nowPos64);
  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;

  return res;
}